

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  size_t sVar2;
  long *plVar3;
  int iVar4;
  Layer *pLVar5;
  long lVar6;
  ParamDict pd;
  Mat local_168;
  void *local_120;
  int *piStack_118;
  size_t local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  size_t local_e0;
  void *local_d8;
  int *piStack_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  int local_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int local_a0;
  size_t local_98;
  void *local_90;
  int *piStack_88;
  size_t local_80;
  int local_78;
  Allocator *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  size_t local_50;
  ModelBinFromMatArray local_40;
  
  if ((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 1)) {
    iVar4 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar4;
  }
  if ((bottom_blob->dims == 1) &&
     (((this->kernel_w == 1 && (this->kernel_h == 1)) &&
      (bottom_blob->elempack * bottom_blob->w == this->weight_data_size / this->num_output)))) {
    pLVar5 = create_layer_cpu(0xf);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,this->num_output);
    ParamDict::set(&pd,1,this->bias_term);
    ParamDict::set(&pd,2,this->weight_data_size);
    ParamDict::set(&pd,8,this->int8_scale_term);
    ParamDict::set(&pd,9,this->activation_type);
    ParamDict::set(&pd,10,&this->activation_params);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
    lVar6 = 0x40;
    do {
      *(undefined8 *)((long)&local_168.data + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe58 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe60 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe64 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe6c + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe78 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe80 + lVar6) = 0;
      *(undefined8 *)(&stack0xfffffffffffffe84 + lVar6) = 0;
      *(undefined8 *)((long)&pd._vptr_ParamDict + lVar6 + 4) = 0;
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x160);
    if (&local_168 != &this->weight_data) {
      piVar1 = (this->weight_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_168.data = (this->weight_data).data;
      piVar1 = (this->weight_data).refcount;
      local_168.refcount._0_4_ = SUB84(piVar1,0);
      local_168.refcount._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
      sVar2 = (this->weight_data).elemsize;
      local_168.elemsize._0_4_ = (undefined4)sVar2;
      local_168.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_168.elempack = (this->weight_data).elempack;
      local_168.allocator = (this->weight_data).allocator;
      local_168.dims = (this->weight_data).dims;
      local_168.w = (this->weight_data).w;
      local_168.h = (this->weight_data).h;
      local_168.d = (this->weight_data).d;
      local_168.c = (this->weight_data).c;
      local_168.cstep = (this->weight_data).cstep;
    }
    if ((Mat *)&local_120 != &this->bias_data) {
      piVar1 = (this->bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      if (piStack_118 != (int *)0x0) {
        LOCK();
        *piStack_118 = *piStack_118 + -1;
        UNLOCK();
        if (*piStack_118 == 0) {
          if (local_100 == (Allocator *)0x0) {
            free(local_120);
          }
          else {
            (*local_100->_vptr_Allocator[3])();
          }
        }
      }
      local_120 = (this->bias_data).data;
      piStack_118 = (this->bias_data).refcount;
      local_110 = (this->bias_data).elemsize;
      local_108 = (this->bias_data).elempack;
      local_100 = (this->bias_data).allocator;
      local_f8 = (this->bias_data).dims;
      iStack_f4 = (this->bias_data).w;
      iStack_f0 = (this->bias_data).h;
      iStack_ec = (this->bias_data).d;
      local_e8 = (this->bias_data).c;
      local_e0 = (this->bias_data).cstep;
    }
    if (this->int8_scale_term != 0) {
      if ((Mat *)&local_d8 != &this->weight_data_int8_scales) {
        piVar1 = (this->weight_data_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        if (piStack_d0 != (int *)0x0) {
          LOCK();
          *piStack_d0 = *piStack_d0 + -1;
          UNLOCK();
          if (*piStack_d0 == 0) {
            if (local_b8 == (Allocator *)0x0) {
              free(local_d8);
            }
            else {
              (*local_b8->_vptr_Allocator[3])();
            }
          }
        }
        local_d8 = (this->weight_data_int8_scales).data;
        piStack_d0 = (this->weight_data_int8_scales).refcount;
        local_c8 = (this->weight_data_int8_scales).elemsize;
        local_c0 = (this->weight_data_int8_scales).elempack;
        local_b8 = (this->weight_data_int8_scales).allocator;
        local_b0 = (this->weight_data_int8_scales).dims;
        iStack_ac = (this->weight_data_int8_scales).w;
        iStack_a8 = (this->weight_data_int8_scales).h;
        iStack_a4 = (this->weight_data_int8_scales).d;
        local_a0 = (this->weight_data_int8_scales).c;
        local_98 = (this->weight_data_int8_scales).cstep;
      }
      if ((Mat *)&local_90 != &this->bottom_blob_int8_scales) {
        piVar1 = (this->bottom_blob_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        if (piStack_88 != (int *)0x0) {
          LOCK();
          *piStack_88 = *piStack_88 + -1;
          UNLOCK();
          if (*piStack_88 == 0) {
            if (local_70 == (Allocator *)0x0) {
              free(local_90);
            }
            else {
              (*local_70->_vptr_Allocator[3])();
            }
          }
        }
        local_90 = (this->bottom_blob_int8_scales).data;
        piStack_88 = (this->bottom_blob_int8_scales).refcount;
        local_80 = (this->bottom_blob_int8_scales).elemsize;
        local_78 = (this->bottom_blob_int8_scales).elempack;
        local_70 = (this->bottom_blob_int8_scales).allocator;
        local_68._0_4_ = (this->bottom_blob_int8_scales).dims;
        local_68._4_4_ = (this->bottom_blob_int8_scales).w;
        uStack_60._0_4_ = (this->bottom_blob_int8_scales).h;
        uStack_60._4_4_ = (this->bottom_blob_int8_scales).d;
        local_58 = (this->bottom_blob_int8_scales).c;
        local_50 = (this->bottom_blob_int8_scales).cstep;
      }
    }
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_168);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
    iVar4 = (*pLVar5->_vptr_Layer[7])(pLVar5,bottom_blob,top_blob,opt);
    (*pLVar5->_vptr_Layer[5])(pLVar5,opt);
    (*pLVar5->_vptr_Layer[1])(pLVar5);
    lVar6 = 0xd8;
    do {
      piVar1 = *(int **)((long)&local_168.refcount + lVar6);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar3 = *(long **)((long)&local_168.allocator + lVar6);
          if (plVar3 == (long *)0x0) {
            free(*(void **)((long)&local_168.data + lVar6));
          }
          else {
            (**(code **)(*plVar3 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_168.cstep + lVar6) = 0;
      *(undefined8 *)((long)&local_168.refcount + lVar6 + 4) = 0;
      *(undefined8 *)((long)&local_168.elemsize + lVar6 + 4) = 0;
      *(undefined8 *)((long)&local_168.data + lVar6) = 0;
      *(undefined8 *)((long)&local_168.refcount + lVar6) = 0;
      *(undefined4 *)((long)&local_168.c + lVar6) = 0;
      *(undefined8 *)((long)&local_168.dims + lVar6) = 0;
      *(undefined8 *)((long)&local_168.h + lVar6) = 0;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != -0x48);
    ParamDict::~ParamDict(&pd);
  }
  else {
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    make_padding(this,bottom_blob,&local_168,opt);
    iVar4 = -100;
    if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
      Mat::create(top_blob,(~((this->kernel_w + -1) * this->dilation_w) + local_168.w) /
                           this->stride_w + 1,
                  (~((this->kernel_h + -1) * this->dilation_h) + local_168.h) / this->stride_h + 1,
                  this->num_output,CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
                  ,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar4 = 0;
        convolution(&local_168,top_blob,&this->weight_data,&this->bias_data,this->kernel_w,
                    this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                    this->activation_type,&this->activation_params,(Option *)pd._vptr_ParamDict);
      }
    }
    piVar1 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w * bottom_blob.elempack == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);
            pd.set(9, activation_type);
            pd.set(10, activation_params);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

#if NCNN_INT8
            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales;
                weights[3] = bottom_blob_int8_scales;
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));

            op->create_pipeline(opt);

            // forward
            int ret = op->forward(bottom_blob, top_blob, opt);

            op->destroy_pipeline(opt);

            delete op;

            return ret;
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}